

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TElasticity2DAnalytic::Sigma
          (TElasticity2DAnalytic *this,TPZVec<double> *x,TPZFMatrix<double> *sigma)

{
  double dVar1;
  REAL RVar2;
  REAL RVar3;
  REAL RVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double local_108;
  REAL nu;
  double local_e0;
  REAL E;
  TPZFNMatrix<4,_double> grad;
  
  TPZFNMatrix<4,_double>::TPZFNMatrix(&grad);
  (*(sigma->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (sigma,2);
  Elastic<double>(x,&E,&nu);
  graduxy<double,double>(this,x,&grad.super_TPZFMatrix<double>);
  RVar4 = E;
  RVar2 = nu;
  if (this->fPlaneStress == 0) {
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,0,0);
    RVar3 = nu;
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,1,1);
    local_e0 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,0,0);
    dVar7 = (RVar4 / (RVar2 + 1.0)) / (1.0 - (RVar2 + RVar2));
    *pdVar5 = (RVar3 * local_e0 + (1.0 - RVar2) * dVar1) * dVar7;
    dVar6 = 1.0 - nu;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,1,1);
    RVar2 = nu;
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,0,0);
    local_e0 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,1,1);
    *pdVar5 = dVar7 * (dVar6 * dVar1 + RVar2 * local_e0);
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,0,1);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,1,0);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,0,1);
    *pdVar5 = (dVar1 + dVar7) * (E / (nu + 1.0 + nu + 1.0));
    pdVar5 = TPZFMatrix<double>::operator()(sigma,0,1);
    local_108 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,1,0);
  }
  else {
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,0,0);
    RVar3 = nu;
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,1,1);
    local_e0 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,0,0);
    dVar6 = RVar4 / (1.0 - RVar2 * RVar2);
    *pdVar5 = (RVar3 * local_e0 + dVar1) * dVar6;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,1,1);
    RVar2 = nu;
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,0,0);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,1,1);
    *pdVar5 = dVar6 * (RVar2 * dVar7 + dVar1);
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,0,1);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(&grad.super_TPZFMatrix<double>,1,0);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,0,1);
    *pdVar5 = (dVar1 + dVar7) * (E / (nu + 1.0 + nu + 1.0));
    pdVar5 = TPZFMatrix<double>::operator()(sigma,0,1);
    local_108 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(sigma,1,0);
  }
  *pdVar5 = local_108;
  TPZFNMatrix<4,_double>::~TPZFNMatrix(&grad);
  return;
}

Assistant:

void TElasticity2DAnalytic::Sigma(const TPZVec<REAL> &x, TPZFMatrix<STATE> &sigma) const
{
    TPZFNMatrix<4,STATE> grad;
    REAL E, nu;
    sigma.Resize(2,2);
    Elastic(x, E, nu);
    graduxy(x,grad);
    //uxy(x,u);
    if (fPlaneStress == 0)
    {
        STATE Fac = E/((STATE)1.+nu)/((STATE(1.)-STATE(2.)*nu));
        sigma(0,0) = Fac*((STATE(1.)-nu)*grad(0,0)+nu*grad(1,1));
        sigma(1,1) = Fac*((STATE(1.)-nu)*grad(1,1)+nu*grad(0,0));
        sigma(0,1) = E/(STATE(2.)*(STATE(1.)+nu))*(grad(0,1)+grad(1,0));
        sigma(1,0) = sigma(0,1);
    }
    else
    {
        STATE Fac = E/((STATE)1.-nu*nu);
        sigma(0,0) = Fac*(grad(0,0)+nu*grad(1,1));
        sigma(1,1) = Fac*(grad(1,1)+nu*grad(0,0));
        sigma(0,1) = E/(STATE(2.)*(STATE(1.)+nu))*(grad(0,1)+grad(1,0));
        sigma(1,0) = sigma(0,1);
    }
}